

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

Node * __thiscall Fl_Preferences::Node::childNode(Node *this,int ix)

{
  Node *pNVar1;
  int iVar2;
  bool bVar3;
  
  createIndex(this);
  if ((this->field_0x30 & 4) == 0) {
    iVar2 = 0;
    for (pNVar1 = this->child_; pNVar1 != (Node *)0x0; pNVar1 = pNVar1->next_) {
      iVar2 = iVar2 + 1;
    }
    pNVar1 = this->child_;
    if ((pNVar1 != (Node *)0x0) && (~ix + iVar2 != 0)) {
      iVar2 = (ix - iVar2) + 2;
      do {
        pNVar1 = pNVar1->next_;
        if (pNVar1 == (Node *)0x0) {
          return (Node *)0x0;
        }
        bVar3 = iVar2 != 0;
        iVar2 = iVar2 + 1;
      } while (bVar3);
    }
  }
  else {
    pNVar1 = this->index_[ix];
  }
  return pNVar1;
}

Assistant:

Fl_Preferences::Node *Fl_Preferences::Node::childNode( int ix ) {
  createIndex();
  if (indexed_) {
    // usually faster access in correct order, but needing more memory
    return index_[ix];
  } else {
    // slow access and reverse order
    int n = nChildren();
    ix = n - ix -1;
    Node *nd;
    for ( nd = child_; nd; nd = nd->next_ ) {
      if ( !ix-- ) break;
      if ( !nd ) break;
    }
    return nd;
  }
}